

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

void __thiscall
BPlusTree_deleteTreeStep4_Test::BPlusTree_deleteTreeStep4_Test(BPlusTree_deleteTreeStep4_Test *this)

{
  BPlusTree_deleteTreeStep4_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BPlusTree_deleteTreeStep4_Test_001a42c8;
  return;
}

Assistant:

TEST (BPlusTree, deleteTreeStep4) {
	BPlusTree bplustree = initDeletion();
	std::cerr << "finish insertion" << std::endl;
	bplustree.DeleteKey(16);
	bplustree.DeleteKey(18);
	bplustree.DeleteKey(17);
	bplustree.DeleteKey(10);
	bplustree.DeleteKey(4);
	bplustree.DeleteKey(13);
	bplustree.DeleteKey(12);
	bplustree.DeleteKey(9);
	bplustree.DeleteKey(15);
	bplustree.DeleteKey(7);
	bplustree.DeleteKey(14);
	bplustree.DeleteKey(1);
	bplustree.DeleteKey(8);
	bplustree.DeleteKey(3);

	PrintTreeWith1Level(bplustree);
}